

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Bool poolGrow(STRING_POOL *pool)

{
  block *pbVar1;
  int iVar2;
  size_t sVar3;
  BLOCK *pBVar4;
  size_t bytesToAllocate_1;
  int blockSize_1;
  BLOCK *tem_1;
  size_t bytesToAllocate;
  int blockSize;
  BLOCK *temp;
  BLOCK *tem;
  STRING_POOL *pool_local;
  
  if (pool->freeBlocks != (BLOCK *)0x0) {
    if (pool->start == (XML_Char *)0x0) {
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = pool->freeBlocks->next;
      pool->blocks->next = (block *)0x0;
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      pool->ptr = pool->start;
      return '\x01';
    }
    if ((long)pool->end - (long)pool->start < (long)pool->freeBlocks->size) {
      pbVar1 = pool->freeBlocks->next;
      pool->freeBlocks->next = pool->blocks;
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = pbVar1;
      memcpy(pool->blocks->s,pool->start,(long)pool->end - (long)pool->start);
      pool->ptr = pool->ptr + (long)pool->blocks + (0xc - (long)pool->start);
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      return '\x01';
    }
  }
  if ((pool->blocks == (BLOCK *)0x0) || (pool->start != pool->blocks->s)) {
    iVar2 = (int)pool->end - (int)pool->start;
    if (iVar2 < 0) {
      return '\0';
    }
    if (iVar2 < 0x400) {
      bytesToAllocate_1._4_4_ = 0x400;
    }
    else {
      if (iVar2 * 2 < 0) {
        return '\0';
      }
      bytesToAllocate_1._4_4_ = iVar2 * 2;
    }
    sVar3 = poolBytesToAllocateFor(bytesToAllocate_1._4_4_);
    if (sVar3 == 0) {
      return '\0';
    }
    pBVar4 = (BLOCK *)(*pool->mem->malloc_fcn)(sVar3);
    if (pBVar4 == (BLOCK *)0x0) {
      return '\0';
    }
    pBVar4->size = bytesToAllocate_1._4_4_;
    pBVar4->next = pool->blocks;
    pool->blocks = pBVar4;
    if (pool->ptr != pool->start) {
      memcpy(pBVar4->s,pool->start,(long)pool->ptr - (long)pool->start);
    }
    pool->ptr = pool->ptr + (0xc - (long)pool->start) + (long)(pBVar4->s + -0xc);
    pool->start = pBVar4->s;
    pool->end = pBVar4->s + bytesToAllocate_1._4_4_;
  }
  else {
    iVar2 = ((int)pool->end - (int)pool->start) * 2;
    if (iVar2 < 0) {
      return '\0';
    }
    sVar3 = poolBytesToAllocateFor(iVar2);
    if (sVar3 == 0) {
      return '\0';
    }
    pBVar4 = (BLOCK *)(*pool->mem->realloc_fcn)(pool->blocks,sVar3 & 0xffffffff);
    if (pBVar4 == (BLOCK *)0x0) {
      return '\0';
    }
    pool->blocks = pBVar4;
    pool->blocks->size = iVar2;
    pool->ptr = pool->ptr + (long)pool->blocks + (0xc - (long)pool->start);
    pool->start = pool->blocks->s;
    pool->end = pool->start + iVar2;
  }
  return '\x01';
}

Assistant:

static XML_Bool FASTCALL
poolGrow(STRING_POOL *pool)
{
  if (pool->freeBlocks) {
    if (pool->start == 0) {
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = pool->freeBlocks->next;
      pool->blocks->next = NULL;
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      pool->ptr = pool->start;
      return XML_TRUE;
    }
    if (pool->end - pool->start < pool->freeBlocks->size) {
      BLOCK *tem = pool->freeBlocks->next;
      pool->freeBlocks->next = pool->blocks;
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = tem;
      memcpy(pool->blocks->s, pool->start,
             (pool->end - pool->start) * sizeof(XML_Char));
      pool->ptr = pool->blocks->s + (pool->ptr - pool->start);
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      return XML_TRUE;
    }
  }
  if (pool->blocks && pool->start == pool->blocks->s) {
    BLOCK *temp;
    int blockSize = (int)((unsigned)(pool->end - pool->start)*2U);
    size_t bytesToAllocate;

    if (blockSize < 0)
      return XML_FALSE;

    bytesToAllocate = poolBytesToAllocateFor(blockSize);
    if (bytesToAllocate == 0)
      return XML_FALSE;

    temp = (BLOCK *)
      pool->mem->realloc_fcn(pool->blocks, (unsigned)bytesToAllocate);
    if (temp == NULL)
      return XML_FALSE;
    pool->blocks = temp;
    pool->blocks->size = blockSize;
    pool->ptr = pool->blocks->s + (pool->ptr - pool->start);
    pool->start = pool->blocks->s;
    pool->end = pool->start + blockSize;
  }
  else {
    BLOCK *tem;
    int blockSize = (int)(pool->end - pool->start);
    size_t bytesToAllocate;

    if (blockSize < 0)
      return XML_FALSE;

    if (blockSize < INIT_BLOCK_SIZE)
      blockSize = INIT_BLOCK_SIZE;
    else {
      /* Detect overflow, avoiding _signed_ overflow undefined behavior */
      if ((int)((unsigned)blockSize * 2U) < 0) {
        return XML_FALSE;
      }
      blockSize *= 2;
    }

    bytesToAllocate = poolBytesToAllocateFor(blockSize);
    if (bytesToAllocate == 0)
      return XML_FALSE;

    tem = (BLOCK *)pool->mem->malloc_fcn(bytesToAllocate);
    if (!tem)
      return XML_FALSE;
    tem->size = blockSize;
    tem->next = pool->blocks;
    pool->blocks = tem;
    if (pool->ptr != pool->start)
      memcpy(tem->s, pool->start,
             (pool->ptr - pool->start) * sizeof(XML_Char));
    pool->ptr = tem->s + (pool->ptr - pool->start);
    pool->start = tem->s;
    pool->end = tem->s + blockSize;
  }
  return XML_TRUE;
}